

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  undefined1 local_38 [8];
  string cacheFile;
  cmake *this_local;
  
  cacheFile.field_2._8_8_ = this;
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  bVar1 = LoadCache(this,psVar3);
  if (!bVar1) {
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_38,(string *)psVar3);
    std::__cxx11::string::operator+=((string *)local_38,"/CMakeCache.txt");
    bVar1 = cmsys::SystemTools::FileExists((string *)local_38);
    if (bVar1) {
      cmSystemTools::Error
                ("There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._4_4_ = -1;
    }
    std::__cxx11::string::~string((string *)local_38);
    if (bVar1) {
      return this_local._4_4_;
    }
  }
  iVar2 = AddCMakePaths(this);
  if (iVar2 == 0) {
    this_local._4_4_ = -3;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory())) {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile = this->GetHomeOutputDirectory();
    cacheFile += "/CMakeCache.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
    }
  }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if (!this->AddCMakePaths()) {
    return -3;
  }
  return 0;
}